

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffsparser.cpp
# Opt level: O3

void __thiscall FfsParser::outputInfo(FfsParser *this)

{
  size_t sVar1;
  char16_t *__s;
  char *pcVar2;
  long lVar3;
  ulong uVar4;
  pointer __s_00;
  vector<std::pair<std::vector<QString,_std::allocator<QString>_>,_QModelIndex>,_std::allocator<std::pair<std::vector<QString,_std::allocator<QString>_>,_QModelIndex>_>_>
  fitTable;
  QString secInfo;
  vector<std::pair<QString,_QModelIndex>,_std::allocator<std::pair<QString,_QModelIndex>_>_>
  messages;
  vector<std::pair<std::vector<QString,_std::allocator<QString>_>,_QModelIndex>,_std::allocator<std::pair<std::vector<QString,_std::allocator<QString>_>,_QModelIndex>_>_>
  local_f8;
  QString local_e0;
  QArrayData *local_c8;
  char *local_c0;
  FfsParser *local_b0;
  QArrayData *local_a8;
  char *local_a0;
  QArrayData *local_90;
  char *local_88;
  QArrayData *local_78;
  char *local_70;
  QArrayData *local_60;
  char *local_58;
  vector<std::pair<QString,_QModelIndex>,_std::allocator<std::pair<QString,_QModelIndex>_>_>
  local_48;
  
  local_b0 = this;
  getMessages(&local_48,this);
  if (local_48.
      super__Vector_base<std::pair<QString,_QModelIndex>,_std::allocator<std::pair<QString,_QModelIndex>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_48.
      super__Vector_base<std::pair<QString,_QModelIndex>,_std::allocator<std::pair<QString,_QModelIndex>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    lVar3 = 0x10;
    uVar4 = 0;
    do {
      QString::toLocal8Bit_helper
                ((QChar *)&local_f8,
                 *(longlong *)
                  ((long)local_48.
                         super__Vector_base<std::pair<QString,_QModelIndex>,_std::allocator<std::pair<QString,_QModelIndex>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar3 + -8));
      __s_00 = local_f8.
               super__Vector_base<std::pair<std::vector<QString,_std::allocator<QString>_>,_QModelIndex>,_std::allocator<std::pair<std::vector<QString,_std::allocator<QString>_>,_QModelIndex>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (local_f8.
          super__Vector_base<std::pair<std::vector<QString,_std::allocator<QString>_>,_QModelIndex>,_std::allocator<std::pair<std::vector<QString,_std::allocator<QString>_>,_QModelIndex>_>_>
          ._M_impl.super__Vector_impl_data._M_finish == (pointer)0x0) {
        __s_00 = (pointer)&QByteArray::_empty;
      }
      sVar1 = strlen((char *)__s_00);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,(char *)__s_00,sVar1)
      ;
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
      std::ostream::put(-0x60);
      std::ostream::flush();
      if (local_f8.
          super__Vector_base<std::pair<std::vector<QString,_std::allocator<QString>_>,_QModelIndex>,_std::allocator<std::pair<std::vector<QString,_std::allocator<QString>_>,_QModelIndex>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        LOCK();
        *(int *)&((local_f8.
                   super__Vector_base<std::pair<std::vector<QString,_std::allocator<QString>_>,_QModelIndex>,_std::allocator<std::pair<std::vector<QString,_std::allocator<QString>_>,_QModelIndex>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->first).
                 super__Vector_base<QString,_std::allocator<QString>_>._M_impl.
                 super__Vector_impl_data._M_start =
             *(int *)&((local_f8.
                        super__Vector_base<std::pair<std::vector<QString,_std::allocator<QString>_>,_QModelIndex>,_std::allocator<std::pair<std::vector<QString,_std::allocator<QString>_>,_QModelIndex>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->first).
                      super__Vector_base<QString,_std::allocator<QString>_>._M_impl.
                      super__Vector_impl_data._M_start + -1;
        UNLOCK();
        if (*(int *)&((local_f8.
                       super__Vector_base<std::pair<std::vector<QString,_std::allocator<QString>_>,_QModelIndex>,_std::allocator<std::pair<std::vector<QString,_std::allocator<QString>_>,_QModelIndex>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->first).
                     super__Vector_base<QString,_std::allocator<QString>_>._M_impl.
                     super__Vector_impl_data._M_start == 0) {
          QArrayData::deallocate
                    ((QArrayData *)
                     local_f8.
                     super__Vector_base<std::pair<std::vector<QString,_std::allocator<QString>_>,_QModelIndex>,_std::allocator<std::pair<std::vector<QString,_std::allocator<QString>_>,_QModelIndex>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,1,8);
        }
      }
      uVar4 = uVar4 + 1;
      lVar3 = lVar3 + 0x30;
    } while (uVar4 < (ulong)(((long)local_48.
                                    super__Vector_base<std::pair<QString,_QModelIndex>,_std::allocator<std::pair<QString,_QModelIndex>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_48.
                                    super__Vector_base<std::pair<QString,_QModelIndex>,_std::allocator<std::pair<QString,_QModelIndex>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 4) *
                            -0x5555555555555555));
  }
  std::
  vector<std::pair<std::vector<QString,_std::allocator<QString>_>,_QModelIndex>,_std::allocator<std::pair<std::vector<QString,_std::allocator<QString>_>,_QModelIndex>_>_>
  ::vector(&local_f8,&local_b0->fitParser->fitTable);
  if (local_f8.
      super__Vector_base<std::pair<std::vector<QString,_std::allocator<QString>_>,_QModelIndex>,_std::allocator<std::pair<std::vector<QString,_std::allocator<QString>_>,_QModelIndex>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_f8.
      super__Vector_base<std::pair<std::vector<QString,_std::allocator<QString>_>,_QModelIndex>,_std::allocator<std::pair<std::vector<QString,_std::allocator<QString>_>,_QModelIndex>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "---------------------------------------------------------------------------",0x4b);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
    std::ostream::put(-0x60);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "     Address      |   Size    |  Ver  | CS  |          Type / Info          ",0x4c);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
    std::ostream::put(-0x60);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "---------------------------------------------------------------------------",0x4b);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
    std::ostream::put(-0x60);
    std::ostream::flush();
    if (local_f8.
        super__Vector_base<std::pair<std::vector<QString,_std::allocator<QString>_>,_QModelIndex>,_std::allocator<std::pair<std::vector<QString,_std::allocator<QString>_>,_QModelIndex>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        local_f8.
        super__Vector_base<std::pair<std::vector<QString,_std::allocator<QString>_>,_QModelIndex>,_std::allocator<std::pair<std::vector<QString,_std::allocator<QString>_>,_QModelIndex>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      lVar3 = 0;
      uVar4 = 0;
      do {
        QString::toLocal8Bit_helper
                  ((QChar *)&local_e0,
                   *(longlong *)
                    (*(long *)((long)&((local_f8.
                                        super__Vector_base<std::pair<std::vector<QString,_std::allocator<QString>_>,_QModelIndex>,_std::allocator<std::pair<std::vector<QString,_std::allocator<QString>_>,_QModelIndex>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->first).
                                      super__Vector_base<QString,_std::allocator<QString>_>._M_impl.
                                      super__Vector_impl_data._M_start + lVar3) + 8));
        __s = local_e0.d.ptr;
        if (local_e0.d.ptr == (char16_t *)0x0) {
          __s = (char16_t *)&QByteArray::_empty;
        }
        sVar1 = strlen((char *)__s);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,(char *)__s,sVar1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," | ",3);
        QString::toLocal8Bit_helper
                  ((QChar *)&local_c8,
                   *(longlong *)
                    (*(long *)((long)&((local_f8.
                                        super__Vector_base<std::pair<std::vector<QString,_std::allocator<QString>_>,_QModelIndex>,_std::allocator<std::pair<std::vector<QString,_std::allocator<QString>_>,_QModelIndex>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->first).
                                      super__Vector_base<QString,_std::allocator<QString>_>._M_impl.
                                      super__Vector_impl_data._M_start + lVar3) + 0x20));
        pcVar2 = local_c0;
        if (local_c0 == (char *)0x0) {
          pcVar2 = (char *)&QByteArray::_empty;
        }
        sVar1 = strlen(pcVar2);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar2,sVar1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," | ",3);
        QString::toLocal8Bit_helper
                  ((QChar *)&local_60,
                   *(longlong *)
                    (*(long *)((long)&((local_f8.
                                        super__Vector_base<std::pair<std::vector<QString,_std::allocator<QString>_>,_QModelIndex>,_std::allocator<std::pair<std::vector<QString,_std::allocator<QString>_>,_QModelIndex>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->first).
                                      super__Vector_base<QString,_std::allocator<QString>_>._M_impl.
                                      super__Vector_impl_data._M_start + lVar3) + 0x38));
        pcVar2 = local_58;
        if (local_58 == (char *)0x0) {
          pcVar2 = (char *)&QByteArray::_empty;
        }
        sVar1 = strlen(pcVar2);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar2,sVar1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," | ",3);
        QString::toLocal8Bit_helper
                  ((QChar *)&local_78,
                   *(longlong *)
                    (*(long *)((long)&((local_f8.
                                        super__Vector_base<std::pair<std::vector<QString,_std::allocator<QString>_>,_QModelIndex>,_std::allocator<std::pair<std::vector<QString,_std::allocator<QString>_>,_QModelIndex>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->first).
                                      super__Vector_base<QString,_std::allocator<QString>_>._M_impl.
                                      super__Vector_impl_data._M_start + lVar3) + 0x50));
        pcVar2 = local_70;
        if (local_70 == (char *)0x0) {
          pcVar2 = (char *)&QByteArray::_empty;
        }
        sVar1 = strlen(pcVar2);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar2,sVar1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," | ",3);
        QString::toLocal8Bit_helper
                  ((QChar *)&local_90,
                   *(longlong *)
                    (*(long *)((long)&((local_f8.
                                        super__Vector_base<std::pair<std::vector<QString,_std::allocator<QString>_>,_QModelIndex>,_std::allocator<std::pair<std::vector<QString,_std::allocator<QString>_>,_QModelIndex>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->first).
                                      super__Vector_base<QString,_std::allocator<QString>_>._M_impl.
                                      super__Vector_impl_data._M_start + lVar3) + 0x68));
        pcVar2 = local_88;
        if (local_88 == (char *)0x0) {
          pcVar2 = (char *)&QByteArray::_empty;
        }
        sVar1 = strlen(pcVar2);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar2,sVar1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," | ",3);
        QString::toLocal8Bit_helper
                  ((QChar *)&local_a8,
                   *(longlong *)
                    (*(long *)((long)&((local_f8.
                                        super__Vector_base<std::pair<std::vector<QString,_std::allocator<QString>_>,_QModelIndex>,_std::allocator<std::pair<std::vector<QString,_std::allocator<QString>_>,_QModelIndex>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->first).
                                      super__Vector_base<QString,_std::allocator<QString>_>._M_impl.
                                      super__Vector_impl_data._M_start + lVar3) + 0x80));
        pcVar2 = local_a0;
        if (local_a0 == (char *)0x0) {
          pcVar2 = (char *)&QByteArray::_empty;
        }
        sVar1 = strlen(pcVar2);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar2,sVar1);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
        std::ostream::put(-0x60);
        std::ostream::flush();
        if (local_a8 != (QArrayData *)0x0) {
          LOCK();
          (local_a8->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_a8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_a8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_a8,1,8);
          }
        }
        if (local_90 != (QArrayData *)0x0) {
          LOCK();
          (local_90->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_90->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_90->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_90,1,8);
          }
        }
        if (local_78 != (QArrayData *)0x0) {
          LOCK();
          (local_78->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_78->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_78->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_78,1,8);
          }
        }
        if (local_60 != (QArrayData *)0x0) {
          LOCK();
          (local_60->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_60->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_60->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_60,1,8);
          }
        }
        if (local_c8 != (QArrayData *)0x0) {
          LOCK();
          (local_c8->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_c8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_c8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_c8,1,8);
          }
        }
        if (&(local_e0.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_e0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_e0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_e0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_e0.d.d)->super_QArrayData,1,8);
          }
        }
        uVar4 = uVar4 + 1;
        lVar3 = lVar3 + 0x30;
      } while (uVar4 < (ulong)(((long)local_f8.
                                      super__Vector_base<std::pair<std::vector<QString,_std::allocator<QString>_>,_QModelIndex>,_std::allocator<std::pair<std::vector<QString,_std::allocator<QString>_>,_QModelIndex>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)local_f8.
                                      super__Vector_base<std::pair<std::vector<QString,_std::allocator<QString>_>,_QModelIndex>,_std::allocator<std::pair<std::vector<QString,_std::allocator<QString>_>,_QModelIndex>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 4) *
                              -0x5555555555555555));
    }
  }
  getSecurityInfo(&local_e0,local_b0);
  if (local_e0.d.size != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "---------------------------------------------------------------------------",0x4b);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
    std::ostream::put(-0x60);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Security Info",0xd);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
    std::ostream::put(-0x60);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "---------------------------------------------------------------------------",0x4b);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
    std::ostream::put(-0x60);
    std::ostream::flush();
    QString::toLocal8Bit_helper((QChar *)&local_c8,(longlong)local_e0.d.ptr);
    if (local_c0 == (char *)0x0) {
      local_c0 = (char *)&QByteArray::_empty;
    }
    sVar1 = strlen(local_c0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_c0,sVar1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
    std::ostream::put(-0x60);
    std::ostream::flush();
    if (local_c8 != (QArrayData *)0x0) {
      LOCK();
      (local_c8->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_c8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_c8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_c8,1,8);
      }
    }
  }
  if (&(local_e0.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_e0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_e0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_e0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_e0.d.d)->super_QArrayData,2,8);
    }
  }
  std::
  vector<std::pair<std::vector<QString,_std::allocator<QString>_>,_QModelIndex>,_std::allocator<std::pair<std::vector<QString,_std::allocator<QString>_>,_QModelIndex>_>_>
  ::~vector(&local_f8);
  std::vector<std::pair<QString,_QModelIndex>,_std::allocator<std::pair<QString,_QModelIndex>_>_>::
  ~vector(&local_48);
  return;
}

Assistant:

void FfsParser::outputInfo(void) {
    // Show ffsParser's messages
    std::vector<std::pair<UString, UModelIndex> > messages = getMessages();
    for (size_t i = 0; i < messages.size(); i++) {
        std::cout << (const char *)messages[i].first.toLocal8Bit() << std::endl;
    }
    
    // Get last VTF
    std::vector<std::pair<std::vector<UString>, UModelIndex > > fitTable = getFitTable();
    if (fitTable.size()) {
        std::cout << "---------------------------------------------------------------------------" << std::endl;
        std::cout << "     Address      |   Size    |  Ver  | CS  |          Type / Info          " << std::endl;
        std::cout << "---------------------------------------------------------------------------" << std::endl;
        for (size_t i = 0; i < fitTable.size(); i++) {
            std::cout
            << (const char *)fitTable[i].first[0].toLocal8Bit() << " | "
            << (const char *)fitTable[i].first[1].toLocal8Bit() << " | "
            << (const char *)fitTable[i].first[2].toLocal8Bit() << " | "
            << (const char *)fitTable[i].first[3].toLocal8Bit() << " | "
            << (const char *)fitTable[i].first[4].toLocal8Bit() << " | "
            << (const char *)fitTable[i].first[5].toLocal8Bit() << std::endl;
        }
    }
    
    // Get security info
    UString secInfo = getSecurityInfo();
    if (!secInfo.isEmpty()) {
        std::cout << "---------------------------------------------------------------------------"  << std::endl;
        std::cout << "Security Info" << std::endl;
        std::cout << "---------------------------------------------------------------------------"  << std::endl;
        std::cout << (const char *)secInfo.toLocal8Bit() << std::endl;
    }
}